

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_qcc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  uint_fast16_t uVar1;
  int iVar2;
  uint_fast16_t in_RCX;
  uint_fast16_t **compparms;
  uint_fast8_t tmp;
  
  uVar1 = ms->len;
  if (cstate->numcomps < 0x101) {
    iVar2 = jpc_getuint8(in,&tmp);
    if (iVar2 != 0) {
      return -1;
    }
    *(ulong *)&ms->parms = (ulong)tmp;
    iVar2 = -1;
  }
  else {
    iVar2 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = -2;
  }
  compparms = &(ms->parms).qcd.compparms.stepsizes;
  iVar2 = jpc_qcx_getcompparms
                    ((jpc_qcxcp_t *)compparms,(jpc_cstate_t *)in,
                     (jas_stream_t *)(long)((int)uVar1 + iVar2),in_RCX);
  if (iVar2 == 0) {
    if ((in->flags_ & 1) == 0) {
      return 0;
    }
    jpc_qcx_destroycompparms((jpc_qcxcp_t *)compparms);
  }
  return -1;
}

Assistant:

static int jpc_qcc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	uint_fast8_t tmp;
	int len;
	len = ms->len;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		qcc->compno = tmp;
		--len;
	} else {
		if (jpc_getuint16(in, &qcc->compno)) {
			return -1;
		}
		len -= 2;
	}
	if (jpc_qcx_getcompparms(&qcc->compparms, cstate, in, len)) {
		return -1;
	}
	if (jas_stream_eof(in)) {
		jpc_qcc_destroyparms(ms);
		return -1;
	}
	return 0;
}